

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct_x86_avx512::create_pipeline_fp16s(InnerProduct_x86_avx512 *this,Option *opt)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  byte *in_RSI;
  long in_RDI;
  int num_input;
  Option *in_stack_00001700;
  int in_stack_00001708;
  int in_stack_0000170c;
  Mat *in_stack_00001710;
  Mat *in_stack_00001718;
  
  innerproduct_transform_kernel_fp16s_sse
            (in_stack_00001718,in_stack_00001710,in_stack_0000170c,in_stack_00001708,
             in_stack_00001700);
  if ((*in_RSI & 1) != 0) {
    puVar3 = (undefined8 *)(in_RDI + 0x130);
    if (*(long *)(in_RDI + 0x138) != 0) {
      piVar2 = *(int **)(in_RDI + 0x138);
      LOCK();
      iVar1 = *piVar2;
      *piVar2 = *piVar2 + -1;
      UNLOCK();
      if (iVar1 == 1) {
        if (*(long *)(in_RDI + 0x150) == 0) {
          if ((void *)*puVar3 != (void *)0x0) {
            free((void *)*puVar3);
          }
        }
        else {
          (**(code **)(**(long **)(in_RDI + 0x150) + 0x18))(*(long **)(in_RDI + 0x150),*puVar3);
        }
      }
    }
    *puVar3 = 0;
    *(undefined8 *)(in_RDI + 0x140) = 0;
    *(undefined4 *)(in_RDI + 0x148) = 0;
    *(undefined4 *)(in_RDI + 0x158) = 0;
    *(undefined4 *)(in_RDI + 0x15c) = 0;
    *(undefined4 *)(in_RDI + 0x160) = 0;
    *(undefined4 *)(in_RDI + 0x164) = 0;
    *(undefined4 *)(in_RDI + 0x168) = 0;
    *(undefined8 *)(in_RDI + 0x170) = 0;
    *(undefined8 *)(in_RDI + 0x138) = 0;
  }
  return 0;
}

Assistant:

int InnerProduct_x86_avx512::create_pipeline_fp16s(const Option& opt)
{
    const int num_input = weight_data_size / num_output;

    innerproduct_transform_kernel_fp16s_sse(weight_data, weight_data_tm, num_input, num_output, opt);

    if (opt.lightmode)
        weight_data.release();

    return 0;
}